

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O1

void Saig_StrSimulateRound(Aig_Man_t *p0,Aig_Man_t *p1)

{
  Aig_Obj_t *pAVar1;
  void *pvVar2;
  void *pvVar3;
  ulong uVar4;
  uint uVar5;
  Aig_Obj_t *pAVar6;
  Vec_Ptr_t *pVVar7;
  int iVar8;
  Aig_Obj_t *pAVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  
  pVVar7 = p0->vObjs;
  if (0 < pVVar7->nSize) {
    lVar12 = 0;
    do {
      pAVar1 = (Aig_Obj_t *)pVVar7->pArray[lVar12];
      if ((pAVar1 != (Aig_Obj_t *)0x0) &&
         ((uVar5 = (uint)*(undefined8 *)&pAVar1->field_0x18, (uVar5 & 7) == 2 ||
          (0xfffffffd < (uVar5 & 7) - 7)))) {
        if (p0->pReprs == (Aig_Obj_t **)0x0) {
          pAVar9 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar9 = p0->pReprs[pAVar1->Id];
        }
        if (pAVar9 != (Aig_Obj_t *)0x0) {
          if (p1->pReprs == (Aig_Obj_t **)0x0) {
            pAVar6 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar6 = p1->pReprs[pAVar9->Id];
          }
          if (pAVar6 != pAVar1) {
            __assert_fail("Aig_ObjRepr(p1, pObj1) == pObj0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigStrSim.c"
                          ,0x132,"void Saig_StrSimulateRound(Aig_Man_t *, Aig_Man_t *)");
          }
          pvVar2 = (pAVar1->field_5).pData;
          lVar11 = 0;
          do {
            uVar5 = Aig_ManRandom(0);
            *(uint *)((long)pvVar2 + lVar11 * 4) = uVar5;
            lVar11 = lVar11 + 1;
          } while (lVar11 != 0x10);
          pvVar2 = (pAVar1->field_5).pData;
          pvVar3 = (pAVar9->field_5).pData;
          lVar11 = 0;
          do {
            *(undefined4 *)((long)pvVar3 + lVar11 * 4) = *(undefined4 *)((long)pvVar2 + lVar11 * 4);
            lVar11 = lVar11 + 1;
          } while (lVar11 != 0x10);
        }
      }
      lVar12 = lVar12 + 1;
      pVVar7 = p0->vObjs;
    } while (lVar12 < pVVar7->nSize);
  }
  lVar12 = 0;
  do {
    pVVar7 = p0->vObjs;
    if (0 < pVVar7->nSize) {
      lVar11 = 0;
      do {
        pAVar1 = (Aig_Obj_t *)pVVar7->pArray[lVar11];
        if (((pAVar1 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar1->field_0x18 & 7) - 7))
           && ((p0->pReprs == (Aig_Obj_t **)0x0 || (p0->pReprs[pAVar1->Id] == (Aig_Obj_t *)0x0)))) {
          Saig_StrSimulateNode(pAVar1,(int)lVar12);
        }
        lVar11 = lVar11 + 1;
        pVVar7 = p0->vObjs;
      } while (lVar11 < pVVar7->nSize);
    }
    if (0 < p0->nRegs) {
      pVVar7 = p0->vCos;
      iVar8 = 0;
      do {
        uVar5 = p0->nTruePos + iVar8;
        if (((int)uVar5 < 0) || (pVVar7->nSize <= (int)uVar5)) goto LAB_006ec0d6;
        pvVar2 = pVVar7->pArray[uVar5];
        uVar4 = *(ulong *)((long)pvVar2 + 8);
        *(uint *)(*(long *)((long)pvVar2 + 0x28) + lVar12 * 4) =
             -((uint)uVar4 & 1) ^
             *(uint *)(*(long *)((uVar4 & 0xfffffffffffffffe) + 0x28) + lVar12 * 4);
        iVar8 = iVar8 + 1;
      } while (iVar8 < p0->nRegs);
    }
    if ((lVar12 != 0xf) && (0 < p0->nRegs)) {
      pVVar7 = p0->vCos;
      iVar8 = 0;
      do {
        uVar5 = p0->nTruePos + iVar8;
        if (((((int)uVar5 < 0) || (pVVar7->nSize <= (int)uVar5)) ||
            (uVar10 = p0->nTruePis + iVar8, (int)uVar10 < 0)) || (p0->vCis->nSize <= (int)uVar10))
        goto LAB_006ec0d6;
        *(undefined4 *)(*(long *)((long)p0->vCis->pArray[uVar10] + 0x28) + 4 + lVar12 * 4) =
             *(undefined4 *)(*(long *)((long)pVVar7->pArray[uVar5] + 0x28) + lVar12 * 4);
        iVar8 = iVar8 + 1;
      } while (iVar8 < p0->nRegs);
    }
    pVVar7 = p1->vObjs;
    if (0 < pVVar7->nSize) {
      lVar11 = 0;
      do {
        pAVar1 = (Aig_Obj_t *)pVVar7->pArray[lVar11];
        if (((pAVar1 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar1->field_0x18 & 7) - 7))
           && ((p1->pReprs == (Aig_Obj_t **)0x0 || (p1->pReprs[pAVar1->Id] == (Aig_Obj_t *)0x0)))) {
          Saig_StrSimulateNode(pAVar1,(int)lVar12);
        }
        lVar11 = lVar11 + 1;
        pVVar7 = p1->vObjs;
      } while (lVar11 < pVVar7->nSize);
    }
    if (0 < p1->nRegs) {
      pVVar7 = p1->vCos;
      iVar8 = 0;
      do {
        uVar5 = p1->nTruePos + iVar8;
        if (((int)uVar5 < 0) || (pVVar7->nSize <= (int)uVar5)) goto LAB_006ec0d6;
        pvVar2 = pVVar7->pArray[uVar5];
        uVar4 = *(ulong *)((long)pvVar2 + 8);
        *(uint *)(*(long *)((long)pvVar2 + 0x28) + lVar12 * 4) =
             -((uint)uVar4 & 1) ^
             *(uint *)(*(long *)((uVar4 & 0xfffffffffffffffe) + 0x28) + lVar12 * 4);
        iVar8 = iVar8 + 1;
      } while (iVar8 < p1->nRegs);
    }
    if ((lVar12 != 0xf) && (0 < p1->nRegs)) {
      pVVar7 = p1->vCos;
      iVar8 = 0;
      do {
        uVar5 = p1->nTruePos + iVar8;
        if (((((int)uVar5 < 0) || (pVVar7->nSize <= (int)uVar5)) ||
            (uVar10 = p1->nTruePis + iVar8, (int)uVar10 < 0)) || (p1->vCis->nSize <= (int)uVar10)) {
LAB_006ec0d6:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        *(undefined4 *)(*(long *)((long)p1->vCis->pArray[uVar10] + 0x28) + 4 + lVar12 * 4) =
             *(undefined4 *)(*(long *)((long)pVVar7->pArray[uVar5] + 0x28) + lVar12 * 4);
        iVar8 = iVar8 + 1;
      } while (iVar8 < p1->nRegs);
    }
    lVar12 = lVar12 + 1;
    if (lVar12 == 0x10) {
      return;
    }
  } while( true );
}

Assistant:

void Saig_StrSimulateRound( Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Aig_Obj_t * pObj0, * pObj1;
    int f, i;
    // simulate the nodes
    Aig_ManForEachObj( p0, pObj0, i )
    {
        if ( !Aig_ObjIsCi(pObj0) && !Aig_ObjIsNode(pObj0) )
           continue;
        pObj1 = Aig_ObjRepr(p0, pObj0);
        if ( pObj1 == NULL )
            continue;
        assert( Aig_ObjRepr(p1, pObj1) == pObj0 );
        Saig_StrSimAssignRandom( pObj0 );
        Saig_StrSimTransfer( pObj0, pObj1 );
    }
    // simulate the timeframes
    for ( f = 0; f < SAIG_WORDS; f++ )
    {
        // simulate the first AIG
        Aig_ManForEachNode( p0, pObj0, i )
            if ( Aig_ObjRepr(p0, pObj0) == NULL )
                Saig_StrSimulateNode( pObj0, f );
        Saig_ManForEachLi( p0, pObj0, i )
            Saig_StrSimSaveOutput( pObj0, f );
        if ( f < SAIG_WORDS - 1 )
            Saig_ManForEachLiLo( p0, pObj0, pObj1, i )
                Saig_StrSimTransferNext( pObj0, pObj1, f );
        // simulate the second AIG
        Aig_ManForEachNode( p1, pObj1, i )
            if ( Aig_ObjRepr(p1, pObj1) == NULL )
                Saig_StrSimulateNode( pObj1, f );
        Saig_ManForEachLi( p1, pObj1, i )
            Saig_StrSimSaveOutput( pObj1, f );
        if ( f < SAIG_WORDS - 1 )
            Saig_ManForEachLiLo( p1, pObj1, pObj0, i )
                Saig_StrSimTransferNext( pObj1, pObj0, f );
    }
}